

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O2

_Bool str_to_bool(char *string,_Bool *out)

{
  char cVar1;
  int iVar2;
  _Bool _Var3;
  
  iVar2 = strcasecmp(string,"true");
  _Var3 = true;
  if ((iVar2 != 0) && ((cVar1 = *string, cVar1 != '1' || (_Var3 = true, string[1] != '\0')))) {
    iVar2 = strcasecmp(string,"false");
    if (iVar2 == 0) {
      _Var3 = false;
    }
    else if ((cVar1 != '0') || (_Var3 = false, string[1] != '\0')) {
      return false;
    }
  }
  *out = _Var3;
  return true;
}

Assistant:

bool str_to_bool(const char *string, bool *out) {
    if ((0 == strcasecmp(string, "true")) || (0 == strcmp(string, "1"))) {
        *out = true;
        return true;
    } else if (0 == strcasecmp(string, "false") || (0 == strcmp(string, "0"))) {
        *out = false;
        return true;
    }

    return false;
}